

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer-source.cc
# Opt level: O1

unique_ptr<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_> __thiscall
wabt::LexerSourceFile::Clone(LexerSourceFile *this)

{
  int iVar1;
  LexerSourceFile *this_00;
  pointer __old_p;
  long *in_RSI;
  Offset offset;
  
  this_00 = (LexerSourceFile *)operator_new(0x30);
  LexerSourceFile(this_00,*(string_view *)(in_RSI + 1));
  iVar1 = (**(code **)(*in_RSI + 0x18))();
  if (iVar1 != 1) {
    iVar1 = (*(this_00->super_LexerSource)._vptr_LexerSource[6])(this_00,0);
    if (iVar1 != 1) goto LAB_00f5eb83;
  }
  (*(this_00->super_LexerSource)._vptr_LexerSource[1])(this_00);
  this_00 = (LexerSourceFile *)0x0;
LAB_00f5eb83:
  (this->super_LexerSource)._vptr_LexerSource = (_func_int **)this_00;
  return (__uniq_ptr_data<wabt::LexerSource,_std::default_delete<wabt::LexerSource>,_true,_true>)
         (__uniq_ptr_data<wabt::LexerSource,_std::default_delete<wabt::LexerSource>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<LexerSource> LexerSourceFile::Clone() {
  std::unique_ptr<LexerSourceFile> result(new LexerSourceFile(filename_));

  Offset offset = 0;
  if (Failed(Tell(&offset)) || Failed(result->Seek(offset))) {
    result.reset();
  }

  return std::move(result);
}